

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void biflog(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  uchar uVar2;
  runsdef *prVar3;
  char buf [4096];
  char acStack_1018 [4104];
  
  prVar3 = ctx->bifcxrun->runcxsp;
  prVar1 = prVar3 + -1;
  uVar2 = prVar3[-1].runstyp;
  ctx->bifcxrun->runcxsp = prVar1;
  if (uVar2 == '\x05') {
    tiologcls(ctx->bifcxtio);
    return;
  }
  if (prVar1->runstyp == '\x03') {
    bifcstr(ctx,acStack_1018,0x1000,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
    tiologopn(ctx->bifcxtio,acStack_1018);
    return;
  }
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

void biflog(bifcxdef *ctx, int argc)
{
    char   buf[OSFNMAX];
    uchar *str;
    
    bifcntargs(ctx, 1, argc);
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        tiologcls(ctx->bifcxtio);
    }
    else
    {
        str = runpopstr(ctx->bifcxrun);
        bifcstr(ctx, buf, (size_t)sizeof(buf), str);
        tiologopn(ctx->bifcxtio, buf);
    }
}